

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Int_t * Pdr_InvMinimizeLits(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  int *piVar4;
  Cnf_Dat_t *p_00;
  sat_solver *pSat_00;
  abctime aVar5;
  int local_70;
  int nLits_1;
  int Save;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  int nRemoved;
  int *pList;
  int *pCube;
  uint local_38;
  int nLits;
  int k;
  int i;
  abctime clk;
  Vec_Int_t *vRes;
  int fVerbose_local;
  Vec_Int_t *vInv_local;
  Gia_Man_t *p_local;
  
  clk = 0;
  aVar3 = Abc_Clock();
  pCube._4_4_ = 0;
  piVar4 = Vec_IntArray(vInv);
  pCnf._4_4_ = 0;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  pList = piVar4 + 1;
  for (nLits = 0; nLits < *piVar4; nLits = nLits + 1) {
    pCube._4_4_ = *pList + pCube._4_4_;
    for (local_38 = 0; (int)local_38 < *pList; local_38 = local_38 + 1) {
      iVar2 = pList[(int)(local_38 + 1)];
      pList[(int)(local_38 + 1)] = -1;
      pSat_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
      iVar1 = Pdr_InvCheck_int(p,vInv,0,pSat_00,1);
      if (iVar1 == 0) {
        if (fVerbose != 0) {
          Abc_Print(1,"Removing lit %d from clause %d.\n",(ulong)local_38,(ulong)(uint)nLits);
        }
        pCnf._4_4_ = pCnf._4_4_ + 1;
      }
      else {
        pList[(int)(local_38 + 1)] = iVar2;
      }
      sat_solver_delete(pSat_00);
    }
    pList = pList + (*pList + 1);
  }
  Cnf_DataFree(p_00);
  if (pCnf._4_4_ == 0) {
    Abc_Print(1,"Invariant minimization did not change the invariant.  ");
  }
  else {
    Abc_Print(1,"Invariant minimization reduced %d literals (out of %d).  ",(ulong)pCnf._4_4_,
              (ulong)pCube._4_4_);
  }
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar3);
  if (0 < (int)pCnf._4_4_) {
    clk = (abctime)Vec_IntAlloc(1000);
    Vec_IntPush((Vec_Int_t *)clk,*piVar4);
    pList = piVar4 + 1;
    for (nLits = 0; nLits < *piVar4; nLits = nLits + 1) {
      local_70 = 0;
      for (local_38 = 0; (int)local_38 < *pList; local_38 = local_38 + 1) {
        if (pList[(int)(local_38 + 1)] != -1) {
          local_70 = local_70 + 1;
        }
      }
      Vec_IntPush((Vec_Int_t *)clk,local_70);
      for (local_38 = 0; (int)local_38 < *pList; local_38 = local_38 + 1) {
        if (pList[(int)(local_38 + 1)] != -1) {
          Vec_IntPush((Vec_Int_t *)clk,pList[(int)(local_38 + 1)]);
        }
      }
      pList = pList + (*pList + 1);
    }
    iVar2 = Vec_IntEntryLast(vInv);
    Vec_IntPush((Vec_Int_t *)clk,iVar2);
  }
  return (Vec_Int_t *)clk;
}

Assistant:

Vec_Int_t * Pdr_InvMinimizeLits( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    Vec_Int_t * vRes = NULL;
    abctime clk = Abc_Clock();
    int i, k, nLits = 0, * pCube, * pList = Vec_IntArray(vInv), nRemoved = 0;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat;
//    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Pdr_ForEachCube( pList, pCube, i )
    {
        nLits += pCube[0];
        for ( k = 0; k < pCube[0]; k++ )
        {
            int Save = pCube[k+1];
            pCube[k+1] = -1;
            //sat_solver_bookmark( pSat );
            pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
            if ( Pdr_InvCheck_int(p, vInv, 0, pSat, 1) )
                pCube[k+1] = Save;
            else
            {
                if ( fVerbose )
                Abc_Print(1, "Removing lit %d from clause %d.\n", k, i );
                nRemoved++;
            }
            sat_solver_delete( pSat );
            //sat_solver_rollback( pSat );
            //sat_solver_bookmark( pSat );
        }
    }
    Cnf_DataFree( pCnf );
    //sat_solver_delete( pSat );
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d literals (out of %d).  ", nRemoved, nLits );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( nRemoved > 0 ) // finished without timeout and removed some lits
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, pList[0] );
        Pdr_ForEachCube( pList, pCube, i )
        {
            int nLits = 0;
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    Vec_IntPush( vRes, pCube[k+1] );
        }
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    return vRes;
}